

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_close_notify(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  size_t sVar7;
  
  if ((ssl == (mbedtls_ssl_context *)0x0) || (ssl->conf == (mbedtls_ssl_config *)0x0)) {
    return -0x7100;
  }
  if (ssl->out_left == 0) {
    if (ssl->state == 0x10) {
      ssl->out_msgtype = 0x15;
      ssl->out_msglen = 2;
      *ssl->out_msg = '\x01';
      ssl->out_msg[1] = '\0';
      iVar3 = mbedtls_ssl_write_record(ssl);
      if (iVar3 != 0) {
        return iVar3;
      }
    }
    return 0;
  }
  if (ssl->f_send == (mbedtls_ssl_send_t *)0x0) {
    return -0x7100;
  }
  sVar7 = ssl->out_left;
  if (sVar7 == 0) {
    iVar3 = 0;
  }
  else {
    do {
      uVar2 = (*ssl->f_send)(ssl->p_bio,
                             ssl->out_hdr +
                             ((ssl->out_msglen + (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4)
                             - sVar7) + 5,sVar7);
      if ((int)uVar2 < 1) {
        return uVar2;
      }
      sVar7 = ssl->out_left - (ulong)uVar2;
      if (ssl->out_left < (ulong)uVar2) {
        return -0x6c00;
      }
      ssl->out_left = sVar7;
    } while (sVar7 != 0);
    uVar5 = 8;
    do {
      uVar2 = (uint)uVar5;
      puVar1 = ssl->out_ctr + (uVar5 - 1);
      *puVar1 = *puVar1 + '\x01';
      if (*puVar1 != '\0') {
        uVar6 = *(uint *)&ssl->conf->field_0x174 & 2;
        break;
      }
      bVar4 = (char)uVar5 - 1;
      uVar5 = (ulong)bVar4;
      uVar6 = *(uint *)&ssl->conf->field_0x174 & 2;
      uVar2 = (uint)bVar4;
    } while (uVar6 < uVar2);
    iVar3 = -0x6b80;
    if (uVar6 != uVar2) {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_ssl_close_notify( mbedtls_ssl_context *ssl )
{
    int ret;

    if( ssl == NULL || ssl->conf == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write close notify" ) );

    if( ssl->out_left != 0 )
        return( mbedtls_ssl_flush_output( ssl ) );

    if( ssl->state == MBEDTLS_SSL_HANDSHAKE_OVER )
    {
        if( ( ret = mbedtls_ssl_send_alert_message( ssl,
                        MBEDTLS_SSL_ALERT_LEVEL_WARNING,
                        MBEDTLS_SSL_ALERT_MSG_CLOSE_NOTIFY ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_send_alert_message", ret );
            return( ret );
        }
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write close notify" ) );

    return( 0 );
}